

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_file_buffer.h
# Opt level: O3

void __thiscall cppcms::http::impl::file_buffer::temp_dir(file_buffer *this,string *tdir)

{
  logic_error *this_00;
  string local_40;
  
  if (this->in_memory_ != false) {
    std::__cxx11::string::_M_assign((string *)&this->temp_dir_);
    return;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x30);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Can\'t update temporary dir for open file","");
  booster::logic_error::logic_error(this_00,&local_40);
  __cxa_throw(this_00,&booster::logic_error::typeinfo,booster::logic_error::~logic_error);
}

Assistant:

void temp_dir(std::string const &tdir)
	{
		if(!in_memory_)
			throw booster::logic_error("Can't update temporary dir for open file");
		temp_dir_ = tdir;
	}